

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

cTValue * lj_ctype_meta(CTState *cts,CTypeID id,MMS mm)

{
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  bool bVar1;
  cTValue *tv;
  CType *ct;
  cTValue *local_88;
  uint *local_80;
  uint local_74;
  cTValue *local_68;
  
  local_80 = (uint *)(*in_RDI + (ulong)in_ESI * 0x10);
  local_74 = in_ESI;
  while( true ) {
    bVar1 = true;
    if (*local_80 >> 0x1c != 8) {
      bVar1 = (*local_80 & 0xf0800000) == 0x20800000;
    }
    if (!bVar1) break;
    local_74 = *local_80 & 0xffff;
    local_80 = (uint *)(*in_RDI + (ulong)local_74 * 0x10);
  }
  if ((*local_80 >> 0x1c == 2) &&
     (*(uint *)(*in_RDI + (ulong)(*local_80 & 0xffff) * 0x10) >> 0x1c == 6)) {
    local_88 = lj_tab_getstr((GCtab *)in_RDI[5],(GCstr *)(in_RDI[3] + 0x80));
  }
  else {
    local_88 = lj_tab_getinth((GCtab *)in_RDI[5],-local_74);
  }
  if ((((local_88 == (cTValue *)0x0) || ((local_88->field_2).it != 0xfffffff4)) ||
      (local_68 = lj_tab_getstr((GCtab *)(ulong)(local_88->u32).lo,
                                (GCstr *)(ulong)*(uint *)(in_RDI[3] + 0x100 + (ulong)in_EDX * 4)),
      local_68 == (cTValue *)0x0)) || ((local_68->field_2).it == 0xffffffff)) {
    local_68 = (cTValue *)0x0;
  }
  return local_68;
}

Assistant:

cTValue *lj_ctype_meta(CTState *cts, CTypeID id, MMS mm)
{
  CType *ct = ctype_get(cts, id);
  cTValue *tv;
  while (ctype_isattrib(ct->info) || ctype_isref(ct->info)) {
    id = ctype_cid(ct->info);
    ct = ctype_get(cts, id);
  }
  if (ctype_isptr(ct->info) &&
      ctype_isfunc(ctype_get(cts, ctype_cid(ct->info))->info))
    tv = lj_tab_getstr(cts->miscmap, &cts->g->strempty);
  else
    tv = lj_tab_getinth(cts->miscmap, -(int32_t)id);
  if (tv && tvistab(tv) &&
      (tv = lj_tab_getstr(tabV(tv), mmname_str(cts->g, mm))) && !tvisnil(tv))
    return tv;
  return NULL;
}